

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O2

void duckdb::DateDiffFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  DatePartSpecifier DVar2;
  reference a;
  reference b;
  reference c;
  NotImplementedException *this;
  allocator local_51;
  string local_50;
  
  a = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  b = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  c = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
  if (a->vector_type != CONSTANT_VECTOR) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,args->count,
               DateDiffTernaryOperator::
               Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long>);
    return;
  }
  puVar1 = (a->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  string_t::GetString_abi_cxx11_(&local_50,(string_t *)a->data);
  DVar2 = GetDatePartSpecifier(&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (DVar2 < BEGIN_INVALID) {
    switch(DVar2) {
    case BEGIN_BIGINT:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::YearOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MONTH:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MonthOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    default:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::DayOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case DECADE:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::DecadeOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case CENTURY:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::CenturyOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MILLENNIUM:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MilleniumOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MICROSECONDS:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MicrosecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MILLISECONDS:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MillisecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::SecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case MINUTE:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::MinutesOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case HOUR:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::HoursOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case WEEK:
    case YEARWEEK:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::WeekOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case ISOYEAR:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::ISOYearOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case QUARTER:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateDiff::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateDiff::QuarterOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result,args->count);
      break;
    case ERA:
    case TIMEZONE:
    case TIMEZONE_HOUR:
    case TIMEZONE_MINUTE:
      goto switchD_00c48a0f_caseD_12;
    }
    return;
  }
switchD_00c48a0f_caseD_12:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Specifier type not implemented for DATEDIFF",&local_51);
  NotImplementedException::NotImplementedException(this,&local_50);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void DateDiffFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);
	auto &part_arg = args.data[0];
	auto &start_arg = args.data[1];
	auto &end_arg = args.data[2];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateDiffBinaryExecutor<T, T, int64_t>(type, start_arg, end_arg, result, args.size());
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<string_t, T, T, int64_t>(
		    part_arg, start_arg, end_arg, result, args.size(),
		    DateDiffTernaryOperator::Operation<string_t, T, T, int64_t>);
	}
}